

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

FFSFormatList AddUniqueFormats(FFSFormatList List,FFSFormatList Candidates,int copy)

{
  size_t sVar1;
  int iVar2;
  FFSFormatBlock *pFVar3;
  char *pcVar4;
  FFSFormatList pFVar5;
  int iVar6;
  FFSFormatBlock *pFVar7;
  FFSFormatList pFVar8;
  FFSFormatList pFVar9;
  
  while (pFVar9 = List, pFVar7 = Candidates, pFVar7 != (FFSFormatBlock *)0x0) {
    iVar6 = 0;
    pFVar5 = (FFSFormatList)0x0;
    for (pFVar8 = pFVar9; pFVar8 != (FFSFormatList)0x0; pFVar8 = pFVar8->Next) {
      if (pFVar8->FormatIDRepLen == pFVar7->FormatIDRepLen) {
        iVar2 = bcmp(pFVar8->FormatIDRep,pFVar7->FormatIDRep,pFVar8->FormatIDRepLen);
        iVar6 = iVar6 + (uint)(iVar2 == 0);
      }
      pFVar5 = pFVar8;
    }
    Candidates = pFVar7->Next;
    List = pFVar9;
    if (iVar6 == 0) {
      if (copy == 0) {
        pFVar7->Next = (FFSFormatBlock *)0x0;
      }
      else {
        pFVar3 = (FFSFormatBlock *)calloc(1,0x28);
        sVar1 = pFVar7->FormatServerRepLen;
        pcVar4 = (char *)malloc(sVar1);
        pFVar3->FormatServerRep = pcVar4;
        memcpy(pcVar4,pFVar7->FormatServerRep,sVar1);
        pFVar3->FormatServerRepLen = pFVar7->FormatServerRepLen;
        sVar1 = pFVar7->FormatIDRepLen;
        pcVar4 = (char *)malloc(sVar1);
        pFVar3->FormatIDRep = pcVar4;
        memcpy(pcVar4,pFVar7->FormatIDRep,sVar1);
        pFVar3->FormatIDRepLen = pFVar7->FormatIDRepLen;
        pFVar7 = pFVar3;
      }
      List = pFVar7;
      if (pFVar5 != (FFSFormatList)0x0) {
        pFVar5->Next = pFVar7;
        List = pFVar9;
      }
    }
  }
  return pFVar9;
}

Assistant:

static FFSFormatList AddUniqueFormats(FFSFormatList List, FFSFormatList Candidates, int copy)
{
    while (Candidates)
    {
        FFSFormatList Last = NULL;
        FFSFormatList Tmp = List;
        int Found = 0;
        FFSFormatList ThisCandidate = Candidates;
        while (Tmp)
        {
            if ((Tmp->FormatIDRepLen == ThisCandidate->FormatIDRepLen) &&
                (memcmp(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, Tmp->FormatIDRepLen) == 0))
            {
                // Identical format already in List, don't add this one
                Found++;
            }
            Last = Tmp;
            Tmp = Tmp->Next;
        }
        Candidates = Candidates->Next;
        if (!Found)
        {
            // New format not in list, add him to tail.
            if (copy)
            {
                // Copy top Candidates entry before return
                FFSFormatList Tmp = malloc(sizeof(*Tmp));
                memset(Tmp, 0, sizeof(*Tmp));
                Tmp->FormatServerRep = malloc(ThisCandidate->FormatServerRepLen);
                memcpy(Tmp->FormatServerRep, ThisCandidate->FormatServerRep,
                       ThisCandidate->FormatServerRepLen);
                Tmp->FormatServerRepLen = ThisCandidate->FormatServerRepLen;
                Tmp->FormatIDRep = malloc(ThisCandidate->FormatIDRepLen);
                memcpy(Tmp->FormatIDRep, ThisCandidate->FormatIDRep, ThisCandidate->FormatIDRepLen);
                Tmp->FormatIDRepLen = ThisCandidate->FormatIDRepLen;
                ThisCandidate = Tmp;
            }
            else
            {
                // disconnect this guy so that he can become list end
                ThisCandidate->Next = NULL;
            }
            if (Last)
            {
                Last->Next = ThisCandidate;
            }
            else
            {
                List = ThisCandidate;
            }
        }
    }
    return List;
}